

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.npatch.c
# Opt level: O2

void snga_add_patch_values
               (Integer type,void *alpha,void *beta,Integer ndim,Integer *loC,Integer *hiC,
               Integer *ldC,void *A_ptr,void *B_ptr,void *C_ptr)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  long local_e8 [7];
  long alStack_b0 [8];
  long alStack_70 [8];
  
  lVar12 = 1;
  for (lVar11 = 1; lVar11 < ndim; lVar11 = lVar11 + 1) {
    lVar12 = lVar12 * ((hiC[lVar11] - loC[lVar11]) + 1);
  }
  local_e8[0] = 0;
  local_e8[1] = 0;
  alStack_70[1] = 1;
  alStack_70[2] = 1;
  alStack_b0[1] = *ldC;
  alStack_b0[2] = *ldC * ldC[1];
  for (lVar11 = 2; lVar11 < ndim; lVar11 = lVar11 + 1) {
    local_e8[lVar11] = 0;
    alStack_70[lVar11 + 1] = ((hiC[lVar11 + -1] - loC[lVar11 + -1]) + 1) * alStack_70[lVar11];
    alStack_b0[lVar11 + 1] = ldC[lVar11] * alStack_b0[lVar11];
  }
  switch(type) {
  case 0x3e9:
    lVar11 = 0;
    if (lVar12 < 1) {
      lVar12 = lVar11;
    }
    while (lVar11 != lVar12) {
      lVar11 = lVar11 + 1;
      lVar14 = 0;
      for (lVar10 = 1; lVar10 < ndim; lVar10 = lVar10 + 1) {
        lVar14 = lVar14 + alStack_b0[lVar10] * local_e8[lVar10];
        lVar13 = local_e8[lVar10] + (ulong)(lVar11 % alStack_70[lVar10 + 1] == 0);
        lVar9 = 0;
        if (lVar13 <= hiC[lVar10] - loC[lVar10]) {
          lVar9 = lVar13;
        }
        local_e8[lVar10] = lVar9;
      }
      lVar10 = *hiC;
      lVar9 = *loC;
      for (lVar13 = 0; lVar13 <= lVar10 - lVar9; lVar13 = lVar13 + 1) {
        *(int *)((long)C_ptr + lVar13 * 4 + lVar14 * 4) =
             *(int *)((long)B_ptr + lVar13 * 4 + lVar14 * 4) * *beta +
             *(int *)((long)A_ptr + lVar13 * 4 + lVar14 * 4) * *alpha;
      }
    }
    break;
  case 0x3ea:
    lVar11 = 0;
    if (lVar12 < 1) {
      lVar12 = lVar11;
    }
    while (lVar11 != lVar12) {
      lVar11 = lVar11 + 1;
      lVar14 = 0;
      for (lVar10 = 1; lVar10 < ndim; lVar10 = lVar10 + 1) {
        lVar14 = lVar14 + alStack_b0[lVar10] * local_e8[lVar10];
        lVar13 = local_e8[lVar10] + (ulong)(lVar11 % alStack_70[lVar10 + 1] == 0);
        lVar9 = 0;
        if (lVar13 <= hiC[lVar10] - loC[lVar10]) {
          lVar9 = lVar13;
        }
        local_e8[lVar10] = lVar9;
      }
      for (lVar10 = 0; lVar10 <= *hiC - *loC; lVar10 = lVar10 + 1) {
        *(long *)((long)C_ptr + lVar10 * 8 + lVar14 * 8) =
             *(long *)((long)B_ptr + lVar10 * 8 + lVar14 * 8) * *beta +
             *(long *)((long)A_ptr + lVar10 * 8 + lVar14 * 8) * *alpha;
      }
    }
    break;
  case 0x3eb:
    lVar11 = 0;
    if (lVar12 < 1) {
      lVar12 = lVar11;
    }
    while (lVar11 != lVar12) {
      lVar11 = lVar11 + 1;
      lVar14 = 0;
      for (lVar10 = 1; lVar10 < ndim; lVar10 = lVar10 + 1) {
        lVar14 = lVar14 + alStack_b0[lVar10] * local_e8[lVar10];
        lVar13 = local_e8[lVar10] + (ulong)(lVar11 % alStack_70[lVar10 + 1] == 0);
        lVar9 = 0;
        if (lVar13 <= hiC[lVar10] - loC[lVar10]) {
          lVar9 = lVar13;
        }
        local_e8[lVar10] = lVar9;
      }
      lVar10 = *hiC;
      lVar9 = *loC;
      for (lVar13 = 0; lVar13 <= lVar10 - lVar9; lVar13 = lVar13 + 1) {
        *(float *)((long)C_ptr + lVar13 * 4 + lVar14 * 4) =
             *alpha * *(float *)((long)A_ptr + lVar13 * 4 + lVar14 * 4) +
             *beta * *(float *)((long)B_ptr + lVar13 * 4 + lVar14 * 4);
      }
    }
    break;
  case 0x3ec:
    lVar11 = 0;
    if (lVar12 < 1) {
      lVar12 = lVar11;
    }
    while (lVar11 != lVar12) {
      lVar11 = lVar11 + 1;
      lVar14 = 0;
      for (lVar10 = 1; lVar10 < ndim; lVar10 = lVar10 + 1) {
        lVar14 = lVar14 + alStack_b0[lVar10] * local_e8[lVar10];
        lVar13 = local_e8[lVar10] + (ulong)(lVar11 % alStack_70[lVar10 + 1] == 0);
        lVar9 = 0;
        if (lVar13 <= hiC[lVar10] - loC[lVar10]) {
          lVar9 = lVar13;
        }
        local_e8[lVar10] = lVar9;
      }
      lVar10 = *hiC;
      lVar9 = *loC;
      for (lVar13 = 0; lVar13 <= lVar10 - lVar9; lVar13 = lVar13 + 1) {
        *(double *)((long)C_ptr + lVar13 * 8 + lVar14 * 8) =
             *alpha * *(double *)((long)A_ptr + lVar13 * 8 + lVar14 * 8) +
             *beta * *(double *)((long)B_ptr + lVar13 * 8 + lVar14 * 8);
      }
    }
    break;
  default:
    pnga_error(" wrong data type ",type);
    return;
  case 0x3ee:
    lVar11 = 0;
    if (lVar12 < 1) {
      lVar12 = lVar11;
    }
    while (lVar11 != lVar12) {
      lVar11 = lVar11 + 1;
      lVar10 = 0;
      for (lVar14 = 1; lVar14 < ndim; lVar14 = lVar14 + 1) {
        lVar10 = lVar10 + alStack_b0[lVar14] * local_e8[lVar14];
        lVar13 = local_e8[lVar14] + (ulong)(lVar11 % alStack_70[lVar14 + 1] == 0);
        lVar9 = 0;
        if (lVar13 <= hiC[lVar14] - loC[lVar14]) {
          lVar9 = lVar13;
        }
        local_e8[lVar14] = lVar9;
      }
      lVar14 = *hiC;
      lVar9 = *loC;
      for (lVar13 = 0; lVar13 <= lVar14 - lVar9; lVar13 = lVar13 + 1) {
        uVar1 = *(undefined8 *)((long)A_ptr + lVar13 * 8 + lVar10 * 8);
        uVar2 = *(undefined8 *)((long)B_ptr + lVar13 * 8 + lVar10 * 8);
        fVar15 = (float)uVar1;
        fVar16 = (float)((ulong)uVar1 >> 0x20);
        fVar17 = (float)uVar2;
        fVar18 = (float)((ulong)uVar2 >> 0x20);
        *(ulong *)((long)C_ptr + lVar13 * 8 + lVar10 * 8) =
             CONCAT44(*(float *)((long)beta + 4) * fVar17 +
                      *beta * fVar18 + *alpha * fVar16 + fVar15 * *(float *)((long)alpha + 4),
                      -*(float *)((long)beta + 4) * fVar18 +
                      *beta * fVar17 + *alpha * fVar15 + fVar16 * -*(float *)((long)alpha + 4));
      }
    }
    break;
  case 0x3ef:
    lVar11 = 0;
    if (lVar12 < 1) {
      lVar12 = lVar11;
    }
    while (lVar11 != lVar12) {
      lVar11 = lVar11 + 1;
      lVar14 = 0;
      for (lVar10 = 1; lVar10 < ndim; lVar10 = lVar10 + 1) {
        lVar14 = lVar14 + alStack_b0[lVar10] * local_e8[lVar10];
        lVar13 = local_e8[lVar10] + (ulong)(lVar11 % alStack_70[lVar10 + 1] == 0);
        lVar9 = 0;
        if (lVar13 <= hiC[lVar10] - loC[lVar10]) {
          lVar9 = lVar13;
        }
        local_e8[lVar10] = lVar9;
      }
      lVar10 = *hiC;
      lVar9 = *loC;
      lVar14 = lVar14 << 4;
      for (lVar13 = 0; lVar13 <= lVar10 - lVar9; lVar13 = lVar13 + 1) {
        dVar5 = *(double *)((long)A_ptr + lVar14);
        dVar6 = ((double *)((long)A_ptr + lVar14))[1];
        dVar7 = *(double *)((long)B_ptr + lVar14);
        dVar8 = ((double *)((long)B_ptr + lVar14))[1];
        dVar4 = *(double *)((long)beta + 8) * dVar7 +
                *beta * dVar8 + *alpha * dVar6 + dVar5 * *(double *)((long)alpha + 8);
        auVar3._8_4_ = SUB84(dVar4,0);
        auVar3._0_8_ = -*(double *)((long)beta + 8) * dVar8 +
                       *beta * dVar7 + *alpha * dVar5 + dVar6 * -*(double *)((long)alpha + 8);
        auVar3._12_4_ = (int)((ulong)dVar4 >> 0x20);
        *(undefined1 (*) [16])((long)C_ptr + lVar14) = auVar3;
        lVar14 = lVar14 + 0x10;
      }
    }
    break;
  case 0x3f8:
    lVar11 = 0;
    if (lVar12 < 1) {
      lVar12 = lVar11;
    }
    while (lVar11 != lVar12) {
      lVar11 = lVar11 + 1;
      lVar14 = 0;
      for (lVar10 = 1; lVar10 < ndim; lVar10 = lVar10 + 1) {
        lVar14 = lVar14 + alStack_b0[lVar10] * local_e8[lVar10];
        lVar13 = local_e8[lVar10] + (ulong)(lVar11 % alStack_70[lVar10 + 1] == 0);
        lVar9 = 0;
        if (lVar13 <= hiC[lVar10] - loC[lVar10]) {
          lVar9 = lVar13;
        }
        local_e8[lVar10] = lVar9;
      }
      lVar10 = *hiC;
      lVar9 = *loC;
      for (lVar13 = 0; lVar13 <= lVar10 - lVar9; lVar13 = lVar13 + 1) {
        *(long *)((long)C_ptr + lVar13 * 8 + lVar14 * 8) =
             *(long *)((long)B_ptr + lVar13 * 8 + lVar14 * 8) * *beta +
             *(long *)((long)A_ptr + lVar13 * 8 + lVar14 * 8) * *alpha;
      }
    }
  }
  return;
}

Assistant:

static void snga_add_patch_values(Integer type, void* alpha, void *beta,
                           Integer ndim, Integer *loC, Integer *hiC, Integer *ldC,
                           void *A_ptr, void *B_ptr, void *C_ptr)
{
  Integer bvalue[MAXDIM], bunit[MAXDIM], baseldC[MAXDIM];
  Integer idx, n1dim;
  Integer i, j;
  /* compute "local" add */

  /* number of n-element of the first dimension */
  n1dim = 1; for(i=1; i<ndim; i++) n1dim *= (hiC[i] - loC[i] + 1);

  /* calculate the destination indices */
  bvalue[0] = 0; bvalue[1] = 0; bunit[0] = 1; bunit[1] = 1;
  /* baseld[0] = ld[0]
   * baseld[1] = ld[0] * ld[1]
   * baseld[2] = ld[0] * ld[1] * ld[2] .....
   */
  baseldC[0] = ldC[0]; baseldC[1] = baseldC[0] *ldC[1];
  for(i=2; i<ndim; i++) {
    bvalue[i] = 0;
    bunit[i] = bunit[i-1] * (hiC[i-1] - loC[i-1] + 1);
    baseldC[i] = baseldC[i-1] * ldC[i];
  }

  switch(type){
    case C_DBL:
      for(i=0; i<n1dim; i++) {
        idx = 0;
        for(j=1; j<ndim; j++) {
          idx += bvalue[j] * baseldC[j-1];
          if(((i+1) % bunit[j]) == 0) bvalue[j]++;
          if(bvalue[j] > (hiC[j]-loC[j])) bvalue[j] = 0;
        }

        for(j=0; j<(hiC[0]-loC[0]+1); j++)
          ((double*)C_ptr)[idx+j] =
            *(double*)alpha *
            ((double*)A_ptr)[idx+j] +
            *(double*)beta *
            ((double*)B_ptr)[idx+j];
      }
      break;
    case C_DCPL:
      for(i=0; i<n1dim; i++) {
        idx = 0;
        for(j=1; j<ndim; j++) {
          idx += bvalue[j] * baseldC[j-1];
          if(((i+1) % bunit[j]) == 0) bvalue[j]++;
          if(bvalue[j] > (hiC[j]-loC[j])) bvalue[j] = 0;
        }

        for(j=0; j<(hiC[0]-loC[0]+1); j++) {
          DoubleComplex a = ((DoubleComplex *)A_ptr)[idx+j];
          DoubleComplex b = ((DoubleComplex *)B_ptr)[idx+j];
          DoubleComplex x= *(DoubleComplex*)alpha;
          DoubleComplex y= *(DoubleComplex*)beta;
          ((DoubleComplex *)C_ptr)[idx+j].real = x.real*a.real -
            x.imag*a.imag + y.real*b.real - y.imag*b.imag;
          ((DoubleComplex *)C_ptr)[idx+j].imag = x.real*a.imag +
            x.imag*a.real + y.real*b.imag + y.imag*b.real;
        }
      }
      break;
    case C_SCPL:
      for(i=0; i<n1dim; i++) {
        idx = 0;
        for(j=1; j<ndim; j++) {
          idx += bvalue[j] * baseldC[j-1];
          if(((i+1) % bunit[j]) == 0) bvalue[j]++;
          if(bvalue[j] > (hiC[j]-loC[j])) bvalue[j] = 0;
        }

        for(j=0; j<(hiC[0]-loC[0]+1); j++) {
          SingleComplex a = ((SingleComplex *)A_ptr)[idx+j];
          SingleComplex b = ((SingleComplex *)B_ptr)[idx+j];
          SingleComplex x= *(SingleComplex*)alpha;
          SingleComplex y= *(SingleComplex*)beta;
          ((SingleComplex *)C_ptr)[idx+j].real = x.real*a.real -
            x.imag*a.imag + y.real*b.real - y.imag*b.imag;
          ((SingleComplex *)C_ptr)[idx+j].imag = x.real*a.imag +
            x.imag*a.real + y.real*b.imag + y.imag*b.real;
        }
      }
      break;
    case C_INT:
      for(i=0; i<n1dim; i++) {
        idx = 0;
        for(j=1; j<ndim; j++) {
          idx += bvalue[j] * baseldC[j-1];
          if(((i+1) % bunit[j]) == 0) bvalue[j]++;
          if(bvalue[j] > (hiC[j]-loC[j])) bvalue[j] = 0;
        }

        for(j=0; j<(hiC[0]-loC[0]+1); j++)
          ((int*)C_ptr)[idx+j] = *(int *)alpha *
            ((int*)A_ptr)[idx+j] + *(int*)beta *
            ((int*)B_ptr)[idx+j];
      }
      break;
    case C_FLOAT:
      for(i=0; i<n1dim; i++) {
        idx = 0;
        for(j=1; j<ndim; j++) {
          idx += bvalue[j] * baseldC[j-1];
          if(((i+1) % bunit[j]) == 0) bvalue[j]++;
          if(bvalue[j] > (hiC[j]-loC[j])) bvalue[j] = 0;
        }

        for(j=0; j<(hiC[0]-loC[0]+1); j++)
          ((float *)C_ptr)[idx+j] = *(float *)alpha *
            ((float *)A_ptr)[idx+j] + *(float *)beta *
            ((float *)B_ptr)[idx+j];
      }
      break;
    case C_LONG:
      for(i=0; i<n1dim; i++) {
        idx = 0;
        for(j=1; j<ndim; j++) {
          idx += bvalue[j] * baseldC[j-1];
          if(((i+1) % bunit[j]) == 0) bvalue[j]++;
          if(bvalue[j] > (hiC[j]-loC[j])) bvalue[j] = 0;
        }

        for(j=0; j<(hiC[0]-loC[0]+1); j++)
          ((long *)C_ptr)[idx+j] = *(long *)alpha *
            ((long *)A_ptr)[idx+j] + *(long *)beta *
            ((long *)B_ptr)[idx+j];
      }
      break;
    case C_LONGLONG:
      for(i=0; i<n1dim; i++) {
        idx = 0;
        for(j=1; j<ndim; j++) {
          idx += bvalue[j] * baseldC[j-1];
          if(((i+1) % bunit[j]) == 0) bvalue[j]++;
          if(bvalue[j] > (hiC[j]-loC[j])) bvalue[j] = 0;
        }

        for(j=0; j<(hiC[0]-loC[0]+1); j++)
          ((long long*)C_ptr)[idx+j] = *(long long*)alpha *
            ((long long*)A_ptr)[idx+j] + *(long long*)beta *
            ((long long*)B_ptr)[idx+j];
      }
      break;
    default: pnga_error(" wrong data type ",type);
  }
}